

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,BoundedZCIS input,MessageLite *msg,ParseFlags parse_flags)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  MessageLite *this_00;
  undefined1 local_90 [8];
  ParseContext ctx;
  
  this_00 = input._8_8_;
  ctx.super_EpsCopyInputStream.buffer_[0x10] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x11] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x12] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x13] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x14] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x15] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x16] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x17] = '\0';
  ctx.super_EpsCopyInputStream.size_ = 0;
  ctx.super_EpsCopyInputStream.limit_ = 0;
  ctx.super_EpsCopyInputStream.zcis_ = (ZeroCopyInputStream *)0x0;
  ctx.super_EpsCopyInputStream.buffer_[0] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[1] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[2] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[3] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[4] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[5] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[6] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[7] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[8] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[9] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[10] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xb] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xc] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xd] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xe] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xf] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x18] = '\x01';
  ctx.super_EpsCopyInputStream.buffer_[0x19] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1a] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1b] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1c] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1d] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1e] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1f] = '\0';
  ctx.super_EpsCopyInputStream.aliasing_ = 0x7fffffff00000000;
  ctx.super_EpsCopyInputStream.last_tag_minus_1_ = io::CodedInputStream::default_recursion_limit_;
  ctx.super_EpsCopyInputStream.overall_limit_ = -0x80000000;
  ctx.depth_ = 0;
  ctx.group_depth_ = 0;
  ctx.data_.pool = (DescriptorPool *)0x0;
  pcVar2 = EpsCopyInputStream::InitFrom
                     ((EpsCopyInputStream *)local_90,(ZeroCopyInputStream *)this,(int)input.zcis);
  iVar1 = (*this_00->_vptr_MessageLite[0xb])(this_00,pcVar2,(EpsCopyInputStream *)local_90);
  if ((char *)CONCAT44(extraout_var,iVar1) != (char *)0x0) {
    EpsCopyInputStream::BackUp((EpsCopyInputStream *)local_90,(char *)CONCAT44(extraout_var,iVar1));
    if ((int)ctx.super_EpsCopyInputStream.aliasing_ == 0) {
      if (((ulong)msg & 2) != 0) {
        return true;
      }
      iVar1 = (*this_00->_vptr_MessageLite[6])(this_00);
      if ((char)iVar1 != '\0') {
        return (bool)(char)iVar1;
      }
      MessageLite::LogInitializationErrorMessage(this_00);
      return false;
    }
  }
  return false;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (PROTOBUF_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}